

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,slang::ast::Type_const*>>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,unsigned_int&,slang::ast::PackedArrayType*&>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,slang::ast::Type_const*>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,try_emplace_args_t *args,uint *args_1,
          PackedArrayType **args_2)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  uint uVar4;
  ushort uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  pgVar2 = arrays_->groups_;
  lVar6 = pos0 * 0x10;
  pgVar1 = pgVar2 + pos0;
  auVar10[0] = -(pgVar1->m[0].n == '\0');
  auVar10[1] = -(pgVar1->m[1].n == '\0');
  auVar10[2] = -(pgVar1->m[2].n == '\0');
  auVar10[3] = -(pgVar1->m[3].n == '\0');
  auVar10[4] = -(pgVar1->m[4].n == '\0');
  auVar10[5] = -(pgVar1->m[5].n == '\0');
  auVar10[6] = -(pgVar1->m[6].n == '\0');
  auVar10[7] = -(pgVar1->m[7].n == '\0');
  auVar10[8] = -(pgVar1->m[8].n == '\0');
  auVar10[9] = -(pgVar1->m[9].n == '\0');
  auVar10[10] = -(pgVar1->m[10].n == '\0');
  auVar10[0xb] = -(pgVar1->m[0xb].n == '\0');
  auVar10[0xc] = -(pgVar1->m[0xc].n == '\0');
  auVar10[0xd] = -(pgVar1->m[0xd].n == '\0');
  auVar10[0xe] = -(pgVar1->m[0xe].n == '\0');
  auVar10[0xf] = -(pgVar1->m[0xf].n == '\0');
  uVar7 = (uint)(ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe);
  if (uVar7 == 0) {
    uVar8 = arrays_->groups_size_mask;
    lVar9 = 1;
    do {
      pgVar2[pos0].m[0xf].n = pgVar2[pos0].m[0xf].n | '\x01' << ((byte)hash & 7);
      pos0 = pos0 + lVar9 & uVar8;
      lVar6 = pos0 * 0x10;
      pgVar1 = pgVar2 + pos0;
      auVar11[0] = -(pgVar1->m[0].n == '\0');
      auVar11[1] = -(pgVar1->m[1].n == '\0');
      auVar11[2] = -(pgVar1->m[2].n == '\0');
      auVar11[3] = -(pgVar1->m[3].n == '\0');
      auVar11[4] = -(pgVar1->m[4].n == '\0');
      auVar11[5] = -(pgVar1->m[5].n == '\0');
      auVar11[6] = -(pgVar1->m[6].n == '\0');
      auVar11[7] = -(pgVar1->m[7].n == '\0');
      auVar11[8] = -(pgVar1->m[8].n == '\0');
      auVar11[9] = -(pgVar1->m[9].n == '\0');
      auVar11[10] = -(pgVar1->m[10].n == '\0');
      auVar11[0xb] = -(pgVar1->m[0xb].n == '\0');
      auVar11[0xc] = -(pgVar1->m[0xc].n == '\0');
      auVar11[0xd] = -(pgVar1->m[0xd].n == '\0');
      auVar11[0xe] = -(pgVar1->m[0xe].n == '\0');
      auVar11[0xf] = -(pgVar1->m[0xf].n == '\0');
      uVar5 = (ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe;
      uVar7 = (uint)uVar5;
      lVar9 = lVar9 + 1;
    } while (uVar5 == 0);
  }
  ppVar3 = arrays_->elements_;
  uVar4 = 0;
  if (uVar7 != 0) {
    for (; (uVar7 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
    }
  }
  uVar8 = (ulong)(uVar4 << 4);
  *(uint *)((long)&ppVar3[pos0 * 0xf].first + uVar8) = *args_1;
  *(PackedArrayType **)((long)&ppVar3[pos0 * 0xf].second + uVar8) = *args_2;
  (pgVar2->m + lVar6)[uVar4].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + ((uint)hash & 0xff));
  __return_storage_ptr__->pg =
       (group15<boost::unordered::detail::foa::plain_integral> *)(pgVar2->m + lVar6);
  __return_storage_ptr__->n = uVar4;
  __return_storage_ptr__->p =
       (pair<const_unsigned_int,_const_slang::ast::Type_*> *)
       ((long)&ppVar3[pos0 * 0xf].first + uVar8);
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }